

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpCommsSS::TcpCommsSS(TcpCommsSS *this)

{
  NetworkCommsInterface::NetworkCommsInterface(&this->super_NetworkCommsInterface,TCP,single);
  (this->super_NetworkCommsInterface).super_CommsInterface._vptr_CommsInterface =
       (_func_int **)&PTR__TcpCommsSS_0054c048;
  this->outgoingConnectionsAllowed = true;
  this->reuse_address = false;
  (this->encryption_config)._M_dataplus._M_p = (pointer)&(this->encryption_config).field_2;
  (this->encryption_config)._M_string_length = 0;
  (this->encryption_config).field_2._M_local_buf[0] = '\0';
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TcpCommsSS::TcpCommsSS() noexcept:
    NetworkCommsInterface(gmlc::networking::InterfaceTypes::TCP,
                          CommsInterface::thread_generation::single)
{
}